

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O2

void __thiscall rengine::GlyphTextureJob::onExecute(GlyphTextureJob *this)

{
  float fVar1;
  float fVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uchar *output;
  uint *__p;
  long lVar6;
  ostream *poVar7;
  int i;
  int out_w;
  ulong uVar8;
  int iVar9;
  stbtt_fontinfo *psVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auStack_108 [8];
  vector<float,_std::allocator<float>_> advances;
  int lineGap;
  undefined1 auStack_b8 [8];
  vector<int,_std::allocator<int>_> glyphs;
  int local_88;
  int local_84;
  int descent;
  int x1;
  int y0;
  int y1;
  undefined1 local_70 [8];
  int g;
  int local_5c;
  stbtt_fontinfo *psStack_58;
  int ascent;
  int local_50;
  int local_4c;
  int leftSideBearing;
  int x0;
  int local_40;
  int advance;
  float local_38;
  value_type_conflict3 local_34 [2];
  float xpos;
  
  lVar5 = std::chrono::_V2::system_clock::now();
  psVar10 = &this->m_context->m_fontInfo;
  leftSideBearing = (int)stbtt_ScaleForPixelHeight(psVar10,(float)this->m_pixelSize);
  psStack_58 = psVar10;
  local_38 = (float)leftSideBearing;
  stbtt_GetFontVMetrics
            (psVar10,&local_5c,&local_88,
             (int *)((long)&advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  auStack_b8 = (undefined1  [8])0x0;
  glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_34[0] = 0.0;
  auStack_108 = (undefined1  [8])0x0;
  advances.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&this->m_text;
  local_40 = 0;
  iVar9 = 0;
  for (uVar8 = 0;
      *(char *)(*(long *)glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + uVar8) != '\0';
      uVar8 = uVar8 + 1) {
    local_70._0_4_ =
         stbtt_FindGlyphIndex
                   (psStack_58,
                    (int)*(char *)(*(long *)glyphs.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage +
                                  uVar8));
    if (1 < uVar8) {
      iVar3 = stbtt_GetCodepointKernAdvance
                        (psStack_58,
                         glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[-1],local_70._0_4_);
      local_34[0] = (float)iVar3 * local_38 + local_34[0];
    }
    psVar10 = psStack_58;
    stbtt_GetGlyphHMetrics(psStack_58,local_70._0_4_,&x0,&local_50);
    advance = (int)local_34[0];
    fVar11 = floorf(local_34[0]);
    stbtt_GetGlyphBitmapBoxSubpixel
              (psVar10,local_70._0_4_,(float)leftSideBearing,(float)leftSideBearing,
               (float)advance - fVar11,0.0,&local_4c,&descent,&local_84,&x1);
    if (iVar9 < local_84 - local_4c) {
      iVar9 = local_84 - local_4c;
    }
    if (local_40 < x1 - descent) {
      local_40 = x1 - descent;
    }
    local_34[0] = (float)(x0 - local_50) * local_38 + local_34[0];
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)auStack_108,local_34);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)auStack_b8,(value_type_conflict2 *)local_70);
  }
  fVar11 = ceilf(local_34[0]);
  this->m_textureWidth = (int)fVar11;
  fVar12 = ceilf((float)(local_5c - local_88) * local_38);
  this->m_textureHeight = (int)fVar12;
  output = (uchar *)malloc((ulong)(uint)(iVar9 * local_40));
  __p = (uint *)calloc((long)((int)fVar12 * (int)fVar11),4);
  std::__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_int,void(*)(void*),void>
            ((__shared_ptr<unsigned_int,(__gnu_cxx::_Lock_policy)2> *)local_70,__p,free);
  std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_textureData).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> *)local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&g);
  fVar11 = (this->m_color).w;
  fVar12 = (this->m_color).x;
  fVar1 = (this->m_color).y;
  fVar2 = (this->m_color).z;
  local_38 = local_38 * (float)local_5c;
  advance = 0;
  uVar4 = 0;
  y1 = iVar9;
  while( true ) {
    iVar9 = y1;
    uVar8 = (ulong)uVar4;
    if ((ulong)((long)glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)auStack_b8 >> 2) <= uVar8) {
      free(output);
      lVar6 = std::chrono::_V2::system_clock::now();
      poVar7 = std::operator<<((ostream *)&std::cout,"generated glyph texture for \'");
      poVar7 = std::operator<<(poVar7,(string *)
                                      glyphs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar7,"\' in ");
      poVar7 = std::ostream::_M_insert<double>(((double)(lVar6 - lVar5) / 1000000000.0) * 1000.0);
      poVar7 = std::operator<<(poVar7," ms");
      std::endl<char,std::char_traits<char>>(poVar7);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)auStack_108);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)auStack_b8);
      return;
    }
    iVar3 = *(int *)((long)auStack_b8 + uVar8 * 4);
    fVar13 = floorf((float)advance);
    y0 = (int)((float)advance - fVar13);
    stbtt_GetGlyphBitmapBoxSubpixel
              (psStack_58,iVar3,(float)leftSideBearing,(float)leftSideBearing,(float)y0,0.0,
               (int *)local_70,&x0,&local_50,&local_4c);
    out_w = local_50 - local_70._0_4_;
    if (iVar9 < out_w) break;
    iVar9 = local_4c - x0;
    if (local_40 < iVar9) {
      __assert_fail("y1 - y0 <= maxBmHeight",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                    ,0xc3,"virtual void rengine::GlyphTextureJob::onExecute()");
    }
    stbtt_MakeGlyphBitmapSubpixel
              (psStack_58,output,out_w,iVar9,out_w,(float)leftSideBearing,(float)leftSideBearing,
               (float)y0,0.0,iVar3);
    renderSingleGlyph(this,(int)(float)advance,(int)((float)x0 + local_38),__p,this->m_textureWidth,
                      this->m_textureHeight,output,out_w,iVar9,(int)(fVar12 * fVar11 * 255.0),
                      (int)(fVar1 * fVar11 * 255.0),(int)(fVar11 * fVar2 * 255.0),
                      (int)(fVar11 * 255.0));
    advance = *(int *)((long)auStack_108 + uVar8 * 4);
    uVar4 = uVar4 + 1;
  }
  __assert_fail("x1 - x0 <= maxBmWidth",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/util/glyphs.h"
                ,0xc2,"virtual void rengine::GlyphTextureJob::onExecute()");
}

Assistant:

inline void GlyphTextureJob::onExecute()
{
    auto start = std::chrono::system_clock::now();

    const stbtt_fontinfo *fontInfo = m_context->fontInfo();
    float scale = stbtt_ScaleForPixelHeight(fontInfo, m_pixelSize);

    int ascent, descent, lineGap;
    stbtt_GetFontVMetrics(fontInfo, &ascent, &descent, &lineGap);

    // std::cout << "GlyphTextureJob::onExecute: text='" << m_text
    //           << "', size=" << m_pixelSize
    //           << ", scale=" << scale
    //           << ", ascent=" << ascent
    //           << ", descent=" << descent
    //           << ", lineGap=" << lineGap
    //           << std::endl;

    std::vector<int> glyphs;
    std::vector<float> advances;

    float xpos = 0;

    int maxBmWidth = 0;
    int maxBmHeight = 0;

    for (int i=0; m_text[i]; ++i) {
        int g = stbtt_FindGlyphIndex(fontInfo, m_text[i]);
        if (i > 1) {
            xpos += scale*stbtt_GetCodepointKernAdvance(fontInfo, glyphs.back(), g);
        }
        int advance, leftSideBearing;
        stbtt_GetGlyphHMetrics(fontInfo, g, &advance, &leftSideBearing);

        float xShift = xpos - (float) std::floor(xpos);
        int x0, x1, y0, y1;
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, g, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);
        maxBmWidth = std::max(x1 - x0, maxBmWidth);
        maxBmHeight = std::max(y1 - y0, maxBmHeight);

        // std::cout << " - '" << m_text[i] << "': index=" << g << ", advance=" << advance << "/" << xpos << ", lsb=" << leftSideBearing
        //           << ", box=" << x0 << "-" << x1 << ", " << y0 << "-" << y1 << std::endl;

        xpos += scale * (advance - leftSideBearing);

        advances.push_back(xpos);
        glyphs.push_back(g);
    }

    m_textureWidth = std::ceil(xpos);
    m_textureHeight = std::ceil((ascent - descent) * scale);

    // std::cout << " - dimensions texture=" << m_textureWidth << "x" << m_textureHeight
    //           << ", bitmap=" << maxBmWidth << "x" << maxBmHeight << std::endl;

    unsigned char *bmData = (unsigned char *) malloc(maxBmWidth * maxBmHeight);
    unsigned int *textureData = (unsigned int *) calloc(m_textureWidth * m_textureHeight, 4);
    m_textureData = std::shared_ptr<unsigned int>(textureData, free);

    int ca = m_color.w * 255;
    int cr = m_color.w * m_color.x * 255;
    int cg = m_color.w * m_color.y * 255;
    int cb = m_color.w * m_color.z * 255;

    float x = 0;
    float y = ascent * scale;
    for (unsigned i=0; i<glyphs.size(); ++i) {
        int glyph = glyphs[i];

        int x0, y0, x1, y1;

        float xShift = x - (float) std::floor(x);
        stbtt_GetGlyphBitmapBoxSubpixel(fontInfo, glyph, scale, scale, xShift, 0, &x0, &y0, &x1, &y1);

        assert(x1 - x0 <= maxBmWidth);
        assert(y1 - y0 <= maxBmHeight);

        int bmw = x1 - x0;
        int bmh = y1 - y0;
        stbtt_MakeGlyphBitmapSubpixel(fontInfo, bmData, bmw, bmh, bmw, scale, scale, xShift, 0, glyph);

        renderSingleGlyph(x, y + y0,
                          textureData, m_textureWidth, m_textureHeight,
                          bmData, bmw, bmh,
                          cr, cg, cb, ca);

        x = advances[i];
    }

    free(bmData);

    auto end = std::chrono::system_clock::now();
    std::chrono::duration<double> diff = end - start;
    std::cout << "generated glyph texture for '" << m_text << "' in " << diff.count() * 1000 << " ms" << std::endl;
}